

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmakecl.cpp
# Opt level: O2

int __thiscall
CTcLibParserCmdline::get_pp_symbol
          (CTcLibParserCmdline *this,char *dst,size_t dst_len,char *sym_name,size_t sym_len)

{
  char *__s;
  size_t __n;
  
  __s = CTcMake::look_up_pp_sym(this->mk_,sym_name,sym_len);
  if (__s == (char *)0x0) {
    __n = 0xffffffffffffffff;
  }
  else {
    __n = strlen(__s);
    if (__n <= dst_len) {
      memcpy(dst,__s,__n);
    }
  }
  return (int)__n;
}

Assistant:

int get_pp_symbol(char *dst, size_t dst_len,
                      const char *sym_name, size_t sym_len)
    {
        const char *val;
        size_t val_len;

        /* ask the 'make' control object for the expansion */
        val = mk_->look_up_pp_sym(sym_name, sym_len);

        /* if we didn't find a value, return undefined */
        if (val == 0)
            return -1;

        /* if it fits in the caller's result buffer, copy it */
        val_len = strlen(val);
        if (val_len <= dst_len)
            memcpy(dst, val, val_len);

        /* return the value length */
        return val_len;
    }